

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall kj::PathPtr::operator<(PathPtr *this,PathPtr other)

{
  ulong uVar1;
  String *pSVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  char *__s2;
  char *__s1;
  ulong uVar6;
  long lVar7;
  
  uVar4 = other.parts.size_;
  uVar1 = (this->parts).size_;
  uVar6 = uVar4;
  if (uVar1 < uVar4) {
    uVar6 = uVar1;
  }
  pSVar2 = (this->parts).ptr;
  lVar7 = uVar6 + 1;
  lVar5 = 8;
  do {
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) {
      return uVar1 < uVar4;
    }
    __s1 = "";
    if (*(long *)((long)&(pSVar2->content).ptr + lVar5) != 0) {
      __s1 = *(char **)((long)pSVar2 + lVar5 + -8);
    }
    __s2 = "";
    if (*(long *)((long)&((other.parts.ptr)->content).ptr + lVar5) != 0) {
      __s2 = *(char **)((long)other.parts.ptr + lVar5 + -8);
    }
    lVar5 = lVar5 + 0x18;
    iVar3 = strcmp(__s1,__s2);
  } while (iVar3 == 0);
  return SUB41((uint)iVar3 >> 0x1f,0);
}

Assistant:

bool PathPtr::operator< (PathPtr other) const {
  for (size_t i = 0; i < kj::min(parts.size(), other.parts.size()); i++) {
    int comp = strcmp(parts[i].cStr(), other.parts[i].cStr());
    if (comp < 0) return true;
    if (comp > 0) return false;
  }

  return parts.size() < other.parts.size();
}